

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_float32_suite::fail_array32_float32_missing_length_four(void)

{
  value_type input [1];
  decoder decoder;
  uchar local_39 [1];
  undefined4 local_38;
  value local_34;
  decoder local_30;
  
  local_39[0] = 0xcd;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>(&local_30,&local_39);
  local_34 = local_30.current.code;
  local_38 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xe0b,"void compact_float32_suite::fail_array32_float32_missing_length_four()",
             &local_34,&local_38);
  return;
}

Assistant:

void fail_array32_float32_missing_length_four()
{
    const value_type input[] = { token::code::array32_float32 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}